

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Instrument * __thiscall Instrument::get_name_abi_cxx11_(Instrument *this)

{
  char *pcVar1;
  long *in_RSI;
  ulong uVar2;
  allocator local_2a;
  undefined1 local_29;
  char *local_28;
  char *c_name;
  int length;
  Instrument *this_local;
  string *result;
  
  this_local = this;
  std::function<void_(ISMSnoopInstrument_*,_char_*,_int_*)>::operator()
            ((function<void_(ISMSnoopInstrument_*,_char_*,_int_*)> *)(*in_RSI + 0x80),
             (ISMSnoopInstrument *)in_RSI[1],(char *)0x0,(int *)((long)&c_name + 4));
  uVar2 = (ulong)(c_name._4_4_ + 1);
  if ((long)uVar2 < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  local_28 = (char *)operator_new__(uVar2);
  std::function<void_(ISMSnoopInstrument_*,_char_*,_int_*)>::operator()
            ((function<void_(ISMSnoopInstrument_*,_char_*,_int_*)> *)(*in_RSI + 0x80),
             (ISMSnoopInstrument *)in_RSI[1],local_28,(int *)((long)&c_name + 4));
  pcVar1 = local_28;
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  if (local_28 != (char *)0x0) {
    operator_delete__(local_28);
  }
  return this;
}

Assistant:

std::string Instrument::get_name() const
{
	int length;

	ismsnoop_->get_name(instrument_, nullptr, &length);

	const auto c_name = new char[length + 1];
	
	ismsnoop_->get_name(instrument_, c_name, &length);

	std::string result(c_name);

	delete[] c_name;

	return result;
}